

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

int CTcPrsOpUnary::parse_embedded_end_tok
              (CTcEmbedTokenList *tl,CTcEmbedLevel *parent,char **open_kw)

{
  int iVar1;
  long lVar2;
  
  *open_kw = "unknown";
  iVar1 = CTcEmbedTokenList::match(tl,"else");
  if (((iVar1 == 0) && (iVar1 = CTcEmbedTokenList::match(tl,"else if *"), iVar1 == 0)) &&
     (iVar1 = CTcEmbedTokenList::match(tl,"else unless *"), iVar1 == 0)) {
    iVar1 = CTcEmbedTokenList::match(tl,"end");
    if (((iVar1 != 0) || (iVar1 = CTcEmbedTokenList::match(tl,"otherwise"), iVar1 != 0)) ||
       ((iVar1 = CTcEmbedTokenList::match(tl,"otherwise if *"), iVar1 != 0 ||
        (iVar1 = CTcEmbedTokenList::match(tl,"otherwise unless *"), iVar1 != 0)))) {
      *open_kw = "<<if>> or <<unless>>";
      iVar1 = CTcEmbedLevel::is_in(parent,1);
      if (iVar1 != 0) {
        return 1;
      }
    }
    iVar1 = CTcEmbedTokenList::match(tl,"or");
    if ((iVar1 != 0) || (iVar1 = CTcEmbedTokenList::match(tl,"||"), iVar1 != 0)) {
      *open_kw = "<<one of>>";
      iVar1 = CTcEmbedLevel::is_in(parent,2);
      if (iVar1 != 0) {
        return 1;
      }
    }
    lVar2 = 0;
    do {
      if (lVar2 + 0x10 == 0xd0) goto LAB_0022d346;
      iVar1 = CTcEmbedTokenList::match(tl,*(char **)((long)&one_of_list[0].endph + lVar2));
      lVar2 = lVar2 + 0x10;
    } while (iVar1 == 0);
    *open_kw = "<<one of>>";
    iVar1 = CTcEmbedLevel::is_in(parent,2);
    if (iVar1 == 0) {
LAB_0022d346:
      iVar1 = CTcEmbedTokenList::match(tl,"only");
      if (iVar1 != 0) {
        *open_kw = "<<first time>>";
        iVar1 = CTcEmbedLevel::is_in(parent,3);
        if (iVar1 != 0) {
          return 1;
        }
      }
      return 0;
    }
  }
  else {
    *open_kw = "<<if>> or <<unless>>";
  }
  return 1;
}

Assistant:

int CTcPrsOpUnary::parse_embedded_end_tok(CTcEmbedTokenList *tl,
                                          CTcEmbedLevel *parent,
                                          const char **open_kw)
{
    /* presume we won't find a closing keyword */
    *open_kw = "unknown";

    /* 
     *   consider ending keywords to always be significant, regardless of
     *   context, since these are unambiguous with valid expressions 
     */
    if (tl->match("else")
        || tl->match("else if *")
        || tl->match("else unless *"))
    {
        *open_kw = "<<if>> or <<unless>>";
        return TRUE;
    }

    /* check for "if" ending tokens - else, end */
    if (tl->match("end")
        || tl->match("otherwise")
        || tl->match("otherwise if *")
        || tl->match("otherwise unless *"))
    {
        *open_kw = "<<if>> or <<unless>>";
        if (parent->is_in(CTcEmbedLevel::If))
            return TRUE;
    }

    /* check for an "or", which delimits branches of a "one of" */
    if (tl->match("or") || tl->match("||"))
    {
        *open_kw = "<<one of>>";
        if (parent->is_in(CTcEmbedLevel::OneOf))
            return TRUE;
    }

    /* check for "one of" ending tokens */
    for (size_t i = 0 ; i < countof(one_of_list) ; ++i)
    {
        if (tl->match(one_of_list[i].endph))
        {
            *open_kw = "<<one of>>";
            if (parent->is_in(CTcEmbedLevel::OneOf))
                return TRUE;
            break;
        }
    }

    /* check for an "only", which ends a "first time" */
    if (tl->match("only"))
    {
        *open_kw = "<<first time>>";
        if (parent->is_in(CTcEmbedLevel::FirstTime))
            return TRUE;
    }

    /* didn't find a close token */
    return FALSE;
}